

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Result rhs;
  Enum EVar2;
  char *pcVar3;
  pointer log_stream;
  uchar *data;
  size_type size;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view sVar5;
  string local_630;
  Enum local_60c;
  undefined1 local_608 [8];
  FileStream stream;
  string local_5c8 [36];
  Enum local_5a4;
  undefined1 local_5a0 [16];
  string_view local_590;
  string_view local_580;
  string_view local_570;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  string_view header_name;
  undefined1 local_530 [8];
  FileStream h_stream;
  undefined1 local_4e8 [8];
  FileStream c_stream;
  string_view local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  undefined1 local_468 [8];
  string header_name_full;
  Result dummy_result;
  undefined1 local_42e [8];
  ValidateOptions options_1;
  undefined1 local_410 [8];
  ReadBinaryOptions options;
  undefined1 local_3e0 [6];
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  Module module;
  Errors errors;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  Enum local_3c;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Result result;
  char **argv_local;
  int argc_local;
  
  wabt::Result::Result
            ((Result *)
             ((long)&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,pcVar3);
  sVar5._M_str = local_38;
  sVar5._M_len = (size_t)local_50._M_str;
  local_3c = (Enum)wabt::ReadFile((wabt *)local_50._M_len,sVar5,in_RCX);
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_3c;
  bVar1 = wabt::Succeeded((Result)local_3c);
  if (bVar1) {
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
    wabt::Module::Module((Module *)local_3e0);
    options._39_1_ = 1;
    options._38_1_ = 1;
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)local_410,&s_features,&log_stream->super_Stream,
               (bool)(s_read_debug_names & 1),true,true);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    options_1.features._14_4_ =
         wabt::ReadBinaryIr(pcVar3,data,size,(ReadBinaryOptions *)local_410,
                            (Errors *)
                            &module.elem_segment_bindings.
                             super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                             ._M_h._M_single_bucket,(Module *)local_3e0);
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)options_1.features._14_4_;
    bVar1 = wabt::Succeeded((Result)options_1.features._14_4_);
    if (bVar1) {
      options_1.features.reference_types_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._4_1_;
      options_1.features.annotations_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._5_1_;
      options_1.features.code_metadata_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._6_1_;
      options_1.features.gc_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._7_1_;
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (bVar1) {
        wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_42e,&s_features);
        file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             wabt::ValidateModule
                       ((Module *)local_3e0,
                        (Errors *)
                        &module.elem_segment_bindings.
                         super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                         ._M_h._M_single_bucket,(ValidateOptions *)local_42e);
        rhs = wabt::GenerateNames((Module *)local_3e0,None);
        wabt::Result::operator|=
                  ((Result *)
                   ((long)&file_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 4),rhs);
      }
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (bVar1) {
        wabt::ApplyNames((Module *)local_3e0);
      }
      header_name_full.field_2._12_4_ =
           file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (bVar1) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          sVar5 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&s_outfile_abi_cxx11_);
          local_498 = strip_extension(sVar5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&local_488,&local_498,(allocator<char> *)&c_stream.field_0x37);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_468,&local_488,".h");
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator((allocator<char> *)&c_stream.field_0x37);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&h_stream.should_close_,
                     pcVar3);
          wabt::FileStream::FileStream
                    ((FileStream *)local_4e8,stack0xfffffffffffffb08,(Stream *)0x0);
          sVar5 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_468);
          header_name._M_str = (char *)sVar5._M_len;
          wabt::FileStream::FileStream((FileStream *)local_530,sVar5,(Stream *)0x0);
          local_560 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_468);
          filename._M_str = local_560._8_8_;
          filename._M_len = (size_t)filename._M_str;
          _local_550 = wabt::GetBasename(local_560._0_8_,filename);
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            (&s_write_c_options.module_name);
          if (bVar1) {
            s_write_c_options.module_name =
                 (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)(module.loc.field_1.field2 + 8));
            local_570 = s_write_c_options.module_name;
            bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                              (&s_write_c_options.module_name);
            if (bVar1) {
              local_5a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&s_infile_abi_cxx11_);
              filename_00._M_str = local_5a0._8_8_;
              filename_00._M_len = (size_t)filename_00._M_str;
              local_590 = wabt::GetBasename(local_5a0._0_8_,filename_00);
              filename_01._M_str = local_590._M_str;
              filename_01._M_len = (size_t)filename_01._M_str;
              local_580 = wabt::StripExtension((wabt *)local_590._M_len,filename_01);
              s_write_c_options.module_name = local_580;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_5c8,(basic_string_view<char,_std::char_traits<char>_> *)local_550,
                     (allocator<char> *)&stream.field_0x37);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          local_5a4 = (Enum)wabt::WriteC((Stream *)local_4e8,(Stream *)local_530,pcVar3,
                                         (Module *)local_3e0,&s_write_c_options);
          file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_5a4;
          std::__cxx11::string::~string(local_5c8);
          std::allocator<char>::~allocator((allocator<char> *)&stream.field_0x37);
          wabt::FileStream::~FileStream((FileStream *)local_530);
          wabt::FileStream::~FileStream((FileStream *)local_4e8);
          std::__cxx11::string::~string((string *)local_468);
        }
        else {
          wabt::FileStream::FileStream((FileStream *)local_608,_stdout,(Stream *)0x0);
          local_60c = (Enum)wabt::WriteC((Stream *)local_608,(Stream *)local_608,"wasm.h",
                                         (Module *)local_3e0,&s_write_c_options);
          file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_60c;
          wabt::FileStream::~FileStream((FileStream *)local_608);
        }
      }
    }
    file = _stderr;
    std::__cxx11::string::string((string *)&local_630);
    wabt::FormatErrorsToFile
              ((Errors *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket,Binary,(LexerSourceLineFinder *)0x0,file,&local_630,Never,
               0x50);
    std::__cxx11::string::~string((string *)&local_630);
    wabt::Module::~Module((Module *)local_3e0);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
  }
  EVar2 = wabt::Result::operator_cast_to_Enum
                    ((Result *)
                     ((long)&file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    const bool kFailOnCustomSectionError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              kFailOnCustomSectionError);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
        result |= GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        if (!s_outfile.empty()) {
          std::string header_name_full =
              std::string(strip_extension(s_outfile)) + ".h";
          FileStream c_stream(s_outfile.c_str());
          FileStream h_stream(header_name_full);
          std::string_view header_name = GetBasename(header_name_full);
          if (s_write_c_options.module_name.empty()) {
            s_write_c_options.module_name = module.name;
            if (s_write_c_options.module_name.empty()) {
              // In the absence of module name in the names section use the
              // filename.
              s_write_c_options.module_name =
                  StripExtension(GetBasename(s_infile));
            }
          }
          result =
              WriteC(&c_stream, &h_stream, std::string(header_name).c_str(),
                     &module, s_write_c_options);
        } else {
          FileStream stream(stdout);
          result =
              WriteC(&stream, &stream, "wasm.h", &module, s_write_c_options);
        }
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}